

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_set_byte_Test::TestBody
          (ByteBufferTest_test_set_byte_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  ByteBuffer buff;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&buff,5);
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)&buff,'\0');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)&buff,'\x01');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)&buff,'\x02');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)&buff,'\x03');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)&buff,'\x04');
  local_58.ptr_._0_4_ = 5;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"5","buff.ReadByte()",(int *)&local_58,(uchar *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xce,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_58.ptr_._0_4_ = 3;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"3","buff.ReadByte()",(int *)&local_58,(uchar *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xcf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_58.ptr_._0_4_ = 1;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"1","buff.ReadByte()",(int *)&local_58,(uchar *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xd0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_58.ptr_._0_4_ = 7;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"7","buff.ReadByte()",(int *)&local_58,(uchar *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xd1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_58.ptr_._0_4_ = 9;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"9","buff.ReadByte()",(int *)&local_58,(uchar *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xd2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&buff);
  return;
}

Assistant:

TEST(ByteBufferTest, test_set_byte)
{
    ByteBuffer buff(5);
    buff.SetByte(0, 5);
    buff.SetByte(1, 3);
    buff.SetByte(2, 1);
    buff.SetByte(3, 7);
    buff.SetByte(4, 9);
    EXPECT_EQ(5, buff.ReadByte());
    EXPECT_EQ(3, buff.ReadByte());
    EXPECT_EQ(1, buff.ReadByte());
    EXPECT_EQ(7, buff.ReadByte());
    EXPECT_EQ(9, buff.ReadByte());
}